

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
duckdb::RandomInitLocalState
          (ExpressionState *state,BoundFunctionExpression *expr,FunctionData *bind_data)

{
  ClientContext *pCVar1;
  pthread_mutex_t *__mutex;
  undefined8 local_20;
  unsigned_long local_18;
  
  pCVar1 = (ClientContext *)duckdb::ExpressionState::GetContext();
  __mutex = (pthread_mutex_t *)duckdb::RandomEngine::Get(pCVar1);
  std::mutex::lock((mutex *)&__mutex->__data);
  local_18 = duckdb::RandomEngine::NextRandomInteger64();
  make_uniq<duckdb::RandomLocalState,unsigned_long>((duckdb *)&local_20,&local_18);
  *(undefined8 *)state = local_20;
  pthread_mutex_unlock(__mutex);
  return (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         state;
}

Assistant:

static unique_ptr<FunctionLocalState> RandomInitLocalState(ExpressionState &state, const BoundFunctionExpression &expr,
                                                           FunctionData *bind_data) {
	auto &random_engine = RandomEngine::Get(state.GetContext());
	lock_guard<mutex> guard(random_engine.lock);
	return make_uniq<RandomLocalState>(random_engine.NextRandomInteger64());
}